

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O3

ans_sint_encode<160U> *
ans_sint_encode<160U>::create
          (ans_sint_encode<160U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  uint *puVar1;
  uint32_t uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer peVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  pointer puVar13;
  uint64_t uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  uint32_t uVar18;
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  uint largest_sym;
  undefined1 auVar27 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  allocator_type local_59;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (n == 0) {
    largest_sym = 0;
  }
  else {
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar27);
      auVar27 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar11 = (byte)uVar10;
      uVar10 = vpcmpuq_avx512f(auVar27,auVar23,2);
      bVar12 = (byte)uVar10;
      uVar19 = CONCAT11(bVar12,bVar11);
      auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in_u32 + uVar15));
      auVar24._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar27._4_4_;
      auVar24._0_4_ = (uint)(bVar11 & 1) * auVar27._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar27._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar27._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar27._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar27._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar27._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar27._28_4_;
      auVar24._32_4_ = (uint)(bVar12 & 1) * auVar27._32_4_;
      auVar24._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar27._36_4_;
      auVar24._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar27._40_4_;
      auVar24._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar27._44_4_;
      auVar24._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar27._48_4_;
      auVar24._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar27._52_4_;
      auVar24._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar27._56_4_;
      auVar24._60_4_ = (uint)(bVar12 >> 7) * auVar27._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar27 = vpmaxud_avx512f(auVar24,auVar25);
    } while ((n + 0xf & 0xfffffffffffffff0) != uVar15);
    auVar21 = vmovdqa32_avx512f(auVar27);
    auVar22._0_4_ = (uint)(bVar11 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar25._0_4_;
    bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar7 * auVar21._4_4_ | (uint)!bVar7 * auVar25._4_4_;
    bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar7 * auVar21._8_4_ | (uint)!bVar7 * auVar25._8_4_;
    bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar7 * auVar21._12_4_ | (uint)!bVar7 * auVar25._12_4_;
    bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar7 * auVar21._16_4_ | (uint)!bVar7 * auVar25._16_4_;
    bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar7 * auVar21._20_4_ | (uint)!bVar7 * auVar25._20_4_;
    bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar7 * auVar21._24_4_ | (uint)!bVar7 * auVar25._24_4_;
    bVar7 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar7 * auVar21._28_4_ | (uint)!bVar7 * auVar25._28_4_;
    auVar22._32_4_ =
         (uint)(bVar12 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar25._32_4_;
    bVar7 = (bool)(bVar12 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar7 * auVar21._36_4_ | (uint)!bVar7 * auVar25._36_4_;
    bVar7 = (bool)(bVar12 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar7 * auVar21._40_4_ | (uint)!bVar7 * auVar25._40_4_;
    bVar7 = (bool)(bVar12 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar7 * auVar21._44_4_ | (uint)!bVar7 * auVar25._44_4_;
    bVar7 = (bool)(bVar12 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar7 * auVar21._48_4_ | (uint)!bVar7 * auVar25._48_4_;
    bVar7 = (bool)(bVar12 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar7 * auVar21._52_4_ | (uint)!bVar7 * auVar25._52_4_;
    bVar7 = (bool)(bVar12 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar7 * auVar21._56_4_ | (uint)!bVar7 * auVar25._56_4_;
    auVar22._60_4_ =
         (uint)(bVar12 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar25._60_4_;
    auVar20 = vextracti64x4_avx512f(auVar22,1);
    auVar21 = vpmaxud_avx512f(auVar22,ZEXT3264(auVar20));
    auVar8 = vpmaxud_avx(auVar21._0_16_,auVar21._16_16_);
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpmaxud_avx(auVar8,auVar9);
    auVar9 = vpshufd_avx(auVar8,0x55);
    auVar8 = vpmaxud_avx(auVar8,auVar9);
    largest_sym = auVar8._0_4_;
  }
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40,(ulong)(largest_sym + 1),(value_type_conflict2 *)&local_58,&local_59);
  if (n != 0) {
    sVar16 = 0;
    do {
      puVar1 = in_u32 + sVar16;
      sVar16 = sVar16 + 1;
      local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar1] =
           local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[*puVar1] + 1;
    } while (n != sVar16);
  }
  adjust_freqs(&local_58,&local_40,largest_sym,false,0xa0);
  puVar13 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  puVar4 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar13;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
    if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  puVar4 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 == puVar5) {
    uVar14 = 0;
  }
  else {
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar23 = vpbroadcastq_avx512f();
    auVar23 = vpsrlq_avx512f(auVar23,2);
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar27);
      auVar27 = vporq_avx512f(auVar24,auVar21);
      auVar24 = vporq_avx512f(auVar24,auVar22);
      uVar10 = vpcmpuq_avx512f(auVar24,auVar23,2);
      bVar11 = (byte)uVar10;
      uVar10 = vpcmpuq_avx512f(auVar27,auVar23,2);
      bVar12 = (byte)uVar10;
      uVar19 = CONCAT11(bVar12,bVar11);
      auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar4 + uVar15));
      auVar26._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar27._4_4_;
      auVar26._0_4_ = (uint)(bVar11 & 1) * auVar27._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar27._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar27._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar27._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar27._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar27._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar27._28_4_;
      auVar26._32_4_ = (uint)(bVar12 & 1) * auVar27._32_4_;
      auVar26._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar27._36_4_;
      auVar26._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar27._40_4_;
      auVar26._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar27._44_4_;
      auVar26._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar27._48_4_;
      auVar26._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar27._52_4_;
      auVar26._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar27._56_4_;
      auVar26._60_4_ = (uint)(bVar12 >> 7) * auVar27._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar27 = vpaddd_avx512f(auVar26,auVar25);
    } while ((((ulong)((long)puVar5 + (-4 - (long)puVar4)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar15);
    auVar21 = vmovdqa32_avx512f(auVar27);
    auVar23._0_4_ = (uint)(bVar11 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar25._0_4_;
    bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar7 * auVar21._4_4_ | (uint)!bVar7 * auVar25._4_4_;
    bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar7 * auVar21._8_4_ | (uint)!bVar7 * auVar25._8_4_;
    bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar7 * auVar21._12_4_ | (uint)!bVar7 * auVar25._12_4_;
    bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar7 * auVar21._16_4_ | (uint)!bVar7 * auVar25._16_4_;
    bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar7 * auVar21._20_4_ | (uint)!bVar7 * auVar25._20_4_;
    bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar7 * auVar21._24_4_ | (uint)!bVar7 * auVar25._24_4_;
    bVar7 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar7 * auVar21._28_4_ | (uint)!bVar7 * auVar25._28_4_;
    auVar23._32_4_ =
         (uint)(bVar12 & 1) * auVar21._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar25._32_4_;
    bVar7 = (bool)(bVar12 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar7 * auVar21._36_4_ | (uint)!bVar7 * auVar25._36_4_;
    bVar7 = (bool)(bVar12 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar7 * auVar21._40_4_ | (uint)!bVar7 * auVar25._40_4_;
    bVar7 = (bool)(bVar12 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar7 * auVar21._44_4_ | (uint)!bVar7 * auVar25._44_4_;
    bVar7 = (bool)(bVar12 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar7 * auVar21._48_4_ | (uint)!bVar7 * auVar25._48_4_;
    bVar7 = (bool)(bVar12 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar7 * auVar21._52_4_ | (uint)!bVar7 * auVar25._52_4_;
    bVar7 = (bool)(bVar12 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar7 * auVar21._56_4_ | (uint)!bVar7 * auVar25._56_4_;
    auVar23._60_4_ =
         (uint)(bVar12 >> 7) * auVar21._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar25._60_4_;
    auVar20 = vextracti64x4_avx512f(auVar23,1);
    auVar21 = vpaddd_avx512f(auVar23,ZEXT3264(auVar20));
    auVar8 = vpaddd_avx(auVar21._0_16_,auVar21._16_16_);
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddd_avx(auVar8,auVar9);
    auVar9 = vpshufd_avx(auVar8,0x55);
    auVar8 = vpaddd_avx(auVar8,auVar9);
    uVar14 = (uint64_t)auVar8._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar14;
  std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar4 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  peVar6 = (__return_storage_ptr__->table).
           super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = 0;
  uVar18 = 0;
  do {
    uVar2 = *(uint32_t *)((long)puVar4 + lVar17);
    if (uVar2 != 0) {
      (&peVar6->freq)[lVar17] = uVar2;
      (&peVar6->base)[lVar17] = uVar18;
      uVar3 = *(uint *)((long)puVar4 + lVar17);
      uVar18 = uVar18 + uVar3;
      *(ulong *)((long)&peVar6->sym_upper_bound + lVar17 * 4) = (ulong)uVar3 << 0x24;
    }
    lVar17 = lVar17 + 4;
  } while ((ulong)largest_sym * 4 + 4 != lVar17);
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_sint_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_sint_encode model;
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            max_sym = std::max(in_u32[i], max_sym);
        }
        std::vector<uint64_t> freqs(max_sym + 1, 0);
        for (size_t i = 0; i < n; i++) {
            freqs[in_u32[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, false, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;

        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym <= max_sym; sym++) {
            if (model.nfreqs[sym] == 0)
                continue;
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }